

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

void __thiscall METADemuxer::updateReport(METADemuxer *this,bool checkTime)

{
  ostream *poVar1;
  bool local_75;
  string local_68;
  int64_t local_48;
  int64_t currentProcessedSize;
  double progress;
  duration<long,_std::ratio<1L,_1000000L>_> local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point currentTime;
  bool checkTime_local;
  METADemuxer *this_local;
  
  currentTime.__d.__r._7_1_ = checkTime;
  local_20.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_75 = true;
  if ((currentTime.__d.__r._7_1_ & 1) != 0) {
    local_28.__r = (rep)std::chrono::operator-(&local_20,&this->m_lastReportTime);
    progress._4_4_ = 250000;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000000l>> *)&local_30,(int *)((long)&progress + 4));
    local_75 = std::chrono::operator>(&local_28,&local_30);
  }
  if (local_75 != false) {
    currentProcessedSize = 0x4059000000000000;
    if (0 < this->m_totalSize) {
      local_48 = getDemuxedSize(this);
      currentProcessedSize = (int64_t)(((double)local_48 / (double)this->m_totalSize) * 100.0);
      if (100.0 < (double)currentProcessedSize) {
        currentProcessedSize = 0x4059000000000000;
      }
    }
    lineBack(this);
    doubleToStr_abi_cxx11_(&local_68,(double *)&currentProcessedSize,1);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_68);
    poVar1 = std::operator<<(poVar1,"% complete");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_68);
    (this->m_lastReportTime).__d.__r = (rep)local_20.__d.__r;
  }
  return;
}

Assistant:

void METADemuxer::updateReport(const bool checkTime)
{
    const auto currentTime = std::chrono::steady_clock::now();
    if (!checkTime || currentTime - m_lastReportTime > std::chrono::microseconds(250000))
    {
        double progress = 100.0;
        if (m_totalSize > 0)
        {
            const int64_t currentProcessedSize = getDemuxedSize();
            progress = static_cast<double>(currentProcessedSize) / static_cast<double>(m_totalSize) * 100.0;
            if (progress > 100.0)
                progress = 100.0;
        }
        lineBack();
        cout << doubleToStr(progress, 1) << "% complete" << std::endl;
        m_lastReportTime = currentTime;
    }
}